

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

ClockingSkewSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ClockingSkewSyntax,slang::parsing::Token&,slang::syntax::TimingControlSyntax*&>
          (BumpAllocator *this,Token *args,TimingControlSyntax **args_1)

{
  TimingControlSyntax *pTVar1;
  Info *pIVar2;
  TokenKind TVar3;
  undefined1 uVar4;
  NumericTokenFlags NVar5;
  uint32_t uVar6;
  ClockingSkewSyntax *pCVar7;
  
  pCVar7 = (ClockingSkewSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((ClockingSkewSyntax *)this->endPtr < pCVar7 + 1) {
    pCVar7 = (ClockingSkewSyntax *)allocateSlow(this,0x28,8);
  }
  else {
    this->head->current = (byte *)(pCVar7 + 1);
  }
  TVar3 = args->kind;
  uVar4 = args->field_0x2;
  NVar5.raw = (args->numFlags).raw;
  uVar6 = args->rawLen;
  pIVar2 = args->info;
  pTVar1 = *args_1;
  (pCVar7->super_SyntaxNode).parent = (SyntaxNode *)0x0;
  (pCVar7->super_SyntaxNode).kind = ClockingSkew;
  (pCVar7->edge).kind = TVar3;
  (pCVar7->edge).field_0x2 = uVar4;
  (pCVar7->edge).numFlags = (NumericTokenFlags)NVar5.raw;
  (pCVar7->edge).rawLen = uVar6;
  (pCVar7->edge).info = pIVar2;
  pCVar7->delay = pTVar1;
  if (pTVar1 != (TimingControlSyntax *)0x0) {
    (pTVar1->super_SyntaxNode).parent = &pCVar7->super_SyntaxNode;
  }
  return pCVar7;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }